

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

int solve(SatPos *SatposSolver,SPP *SppSolver,ReadData *decoder,ELLIPSOID type,string *path)

{
  double dVar1;
  BLH blh;
  XYZ Ref;
  XYZ xyz;
  bool bVar2;
  SPP *pSVar3;
  ReadData *this;
  int iVar4;
  long lVar5;
  SatPos *this_00;
  SPPResult *pSVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  int iVar9;
  byte bVar10;
  Satellite *local_38e0;
  Ephemeris *local_38d8;
  Obs *local_38d0;
  SatPos *local_38c8;
  Ephemeris *local_38c0;
  Obs *local_38b8;
  SPP *local_38b0;
  ReadData *local_38a8;
  string *local_38a0;
  double local_3898;
  string local_3890 [32];
  undefined8 local_3870;
  undefined8 uStack_3868;
  double local_3860;
  SPPResult local_3858;
  SPPResult result;
  undefined8 local_12e8 [599];
  
  bVar10 = 0;
  local_38c8 = SatposSolver;
  local_38a0 = path;
  SPP::GetResult(&result,SppSolver);
  if ((result.UserRefPositionXYZ.X == -1.0) && (!NAN(result.UserRefPositionXYZ.X))) {
    ReadData::GetUserPos(decoder);
    if ((local_3858.UserPositionXYZ.X != 0.0) || (NAN(local_3858.UserPositionXYZ.X))) {
      ReadData::GetUserPos(decoder);
      blh.L = (double)uStack_3868;
      blh.B = (double)local_3870;
      blh.H = local_3860;
      BLH2XYZ(blh,type,&result.UserRefPositionXYZ);
      Ref.Y = result.UserRefPositionXYZ.Y;
      Ref.X = result.UserRefPositionXYZ.X;
      Ref.Z = result.UserRefPositionXYZ.Z;
      SPP::setRefPos(SppSolver,Ref);
    }
  }
  dVar1 = result.GPSR + result.BDSR;
  iVar9 = 0xb;
  local_38b0 = SppSolver;
  local_38a8 = decoder;
  do {
    this_00 = local_38c8;
    iVar9 = iVar9 + -1;
    if (iVar9 == 0) {
      bVar2 = true;
      break;
    }
    local_3898 = dVar1;
    local_3858.ObsTime._0_8_ = ReadData::GetGPSEph(decoder);
    local_38e0 = (Satellite *)ReadData::GetGPSObs(decoder);
    pSVar6 = &result;
    puVar7 = (undefined8 *)&stack0xffffffffffffb458;
    for (lVar5 = 599; lVar5 != 0; lVar5 = lVar5 + -1) {
      *puVar7 = *(undefined8 *)&pSVar6->ObsTime;
      pSVar6 = (SPPResult *)((long)pSVar6 + (ulong)bVar10 * -0x10 + 8);
      puVar7 = puVar7 + (ulong)bVar10 * -2 + 1;
    }
    iVar4 = SatPos::CalculateGPSPos(this_00,&local_3858,&local_38e0);
    if (iVar4 != 0) {
LAB_00104922:
      bVar2 = false;
      break;
    }
    local_3858.ObsTime._0_8_ = ReadData::GetGPSEph(decoder);
    pSVar6 = &result;
    puVar7 = (undefined8 *)&stack0xffffffffffffb458;
    for (lVar5 = 599; lVar5 != 0; lVar5 = lVar5 + -1) {
      *puVar7 = *(undefined8 *)&pSVar6->ObsTime;
      pSVar6 = (SPPResult *)((long)pSVar6 + (ulong)bVar10 * -0x10 + 8);
      puVar7 = puVar7 + (ulong)bVar10 * -2 + 1;
    }
    iVar4 = SatPos::CalculateSatVel(this_00,&local_3858,0);
    if (iVar4 != 0) goto LAB_00104922;
    local_3858.ObsTime._0_8_ = ReadData::GetBDSEph(decoder);
    local_38e0 = (Satellite *)ReadData::GetBDSObs(decoder);
    pSVar6 = &result;
    puVar7 = (undefined8 *)&stack0xffffffffffffb458;
    for (lVar5 = 599; lVar5 != 0; lVar5 = lVar5 + -1) {
      *puVar7 = *(undefined8 *)&pSVar6->ObsTime;
      pSVar6 = (SPPResult *)((long)pSVar6 + (ulong)bVar10 * -0x10 + 8);
      puVar7 = puVar7 + (ulong)bVar10 * -2 + 1;
    }
    iVar4 = SatPos::CalculateBDSPos(this_00,&local_3858,&local_38e0);
    if (iVar4 != 0) goto LAB_00104922;
    local_3858.ObsTime._0_8_ = ReadData::GetBDSEph(decoder);
    pSVar6 = &result;
    puVar7 = (undefined8 *)&stack0xffffffffffffb458;
    for (lVar5 = 599; lVar5 != 0; lVar5 = lVar5 + -1) {
      *puVar7 = *(undefined8 *)&pSVar6->ObsTime;
      pSVar6 = (SPPResult *)((long)pSVar6 + (ulong)bVar10 * -0x10 + 8);
      puVar7 = puVar7 + (ulong)bVar10 * -2 + 1;
    }
    iVar4 = SatPos::CalculateSatVel(this_00,&local_3858,4);
    if (iVar4 != 0) goto LAB_00104922;
    bVar2 = true;
    local_3858.ObsTime._0_8_ = SatPos::GetPosAndVel(this_00,GPS);
    local_38e0 = SatPos::GetPosAndVel(this_00,BDS);
    local_38d0 = ReadData::GetGPSObs(decoder);
    local_38b8 = ReadData::GetBDSObs(decoder);
    local_38c0 = ReadData::GetGPSEph(decoder);
    local_38d8 = ReadData::GetBDSEph(decoder);
    pSVar3 = local_38b0;
    iVar4 = SPP::solveSPP(local_38b0,(Satellite **)&local_3858,&local_38e0,&local_38d0,&local_38b8,
                          &local_38c0,&local_38d8,type);
    if (iVar4 != 0) {
      bVar2 = false;
      this_00 = local_38c8;
      break;
    }
    SPP::GetResult(&local_3858,pSVar3);
    memcpy(&result,&local_3858,0x12b8);
    dVar1 = result.GPSR + result.BDSR;
    this_00 = local_38c8;
  } while (1e-10 <= ABS(dVar1 - local_3898));
  local_3858.ObsTime._0_8_ = SatPos::GetPosAndVel(this_00,GPS);
  local_38e0 = SatPos::GetPosAndVel(this_00,BDS);
  this = local_38a8;
  local_38d0 = ReadData::GetGPSObs(local_38a8);
  local_38b8 = ReadData::GetBDSObs(this);
  local_38c0 = ReadData::GetGPSEph(this);
  local_38d8 = ReadData::GetBDSEph(this);
  pSVar3 = local_38b0;
  SPP::solveSPV(local_38b0,(Satellite **)&local_3858,&local_38e0,&local_38d0,&local_38b8,&local_38c0
                ,&local_38d8,type);
  SPP::GetResult(&local_3858,pSVar3);
  memcpy(&result,&local_3858,0x12b8);
  if (bVar2) {
    local_3858.ObsTime._0_8_ = SatPos::GetPosAndVel(this_00,GPS);
    local_38e0 = SatPos::GetPosAndVel(this_00,BDS);
    local_38d0 = ReadData::GetGPSObs(this);
    local_38b8 = ReadData::GetBDSObs(this);
    local_38c0 = ReadData::GetGPSEph(this);
    local_38d8 = ReadData::GetBDSEph(this);
    SPP::solveSPV(pSVar3,(Satellite **)&local_3858,&local_38e0,&local_38d0,&local_38b8,&local_38c0,
                  &local_38d8,type);
    SPP::GetResult(&local_3858,pSVar3);
    memcpy(&result,&local_3858,0x12b8);
    xyz.Y = result.UserPositionXYZ.Y;
    xyz.X = result.UserPositionXYZ.X;
    xyz.Z = result.UserPositionXYZ.Z;
    operator<<((ostream *)&std::cout,xyz);
    memcpy(local_12e8,&result,0x12b8);
    std::__cxx11::string::string(local_3890,(string *)local_38a0);
    puVar7 = local_12e8;
    puVar8 = (undefined8 *)&stack0xffffffffffffb458;
    for (lVar5 = 599; lVar5 != 0; lVar5 = lVar5 + -1) {
      *puVar8 = *puVar7;
      puVar7 = puVar7 + (ulong)bVar10 * -2 + 1;
      puVar8 = puVar8 + (ulong)bVar10 * -2 + 1;
    }
    WriteToFile(local_3890);
    std::__cxx11::string::~string(local_3890);
    ReadData::ResetObs(this);
  }
  return 0;
}

Assistant:

int solve(SatPos &SatposSolver, SPP &SppSolver, ReadData &decoder, ELLIPSOID type, string path) {
    SPPResult result = SppSolver.GetResult();
    if(result.UserRefPositionXYZ.X == -1 && decoder.GetUserPos().H != 0) {
        BLH2XYZ(decoder.GetUserPos(), type, result.UserRefPositionXYZ);
        SppSolver.setRefPos(result.UserRefPositionXYZ);
    }
    // if(SppSolver.re)
    double dt0 = result.GPSR + result.BDSR;
    int count = 0;
    int flag;
    // SATTIME obs;
    while(count < 10)
    {
        flag = SatposSolver.CalculateGPSPos(decoder.GetGPSEph(), decoder.GetGPSObs(), result);
        if(flag != 0)
            break;
        flag = SatposSolver.CalculateSatVel(decoder.GetGPSEph(), GPS, result);
        if(flag != 0)
            break;
        flag = SatposSolver.CalculateBDSPos(decoder.GetBDSEph(), decoder.GetBDSObs(), result);
        if(flag != 0)
            break;
        flag = SatposSolver.CalculateSatVel(decoder.GetBDSEph(), BDS, result);
        if(flag != 0)
            break;
        flag = SppSolver.solveSPP(SatposSolver.GetPosAndVel(GPS), SatposSolver.GetPosAndVel(BDS), 
                            decoder.GetGPSObs(), decoder.GetBDSObs(), 
                            decoder.GetGPSEph(), decoder.GetBDSEph(), type);

        if(flag != 0)
            break;
        result = SppSolver.GetResult();
        double dt1 = result.GPSR + result.BDSR;
        if(abs(dt1 - dt0) < 1e-10)
        {
            break;
        }
        dt0 = dt1;
        count ++;
    } 
    SppSolver.solveSPV(SatposSolver.GetPosAndVel(GPS), SatposSolver.GetPosAndVel(BDS), 
                        decoder.GetGPSObs(), decoder.GetBDSObs(), 
                        decoder.GetGPSEph(), decoder.GetBDSEph(), type);
    result = SppSolver.GetResult();
    if(flag == 0) {
        SppSolver.solveSPV(SatposSolver.GetPosAndVel(GPS), SatposSolver.GetPosAndVel(BDS), 
                            decoder.GetGPSObs(), decoder.GetBDSObs(), 
                            decoder.GetGPSEph(), decoder.GetBDSEph(), type);
        result = SppSolver.GetResult();

        cout << result.UserPositionXYZ;
        WriteToFile(result, path);
        decoder.ResetObs();
    }
    return 0;
}